

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O1

Expression *
slang::ast::StringLiteral::fromSyntax(ASTContext *context,LiteralExpressionSyntax *syntax)

{
  Token *this;
  Compilation *this_00;
  undefined1 auVar1 [16];
  Diagnostic *this_01;
  Expression *pEVar2;
  ConstantValue *args_3;
  Type *args;
  StringLiteral *pSVar3;
  char *pcVar4;
  bitwidth_t width;
  size_t sVar5;
  reverse_iterator<const_char_*> __end3;
  SourceRange sourceRange;
  SmallVector<std::byte,_40UL> bytes;
  string_view value;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_c8;
  uint local_c0;
  undefined2 local_bc;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_b8;
  SourceLocation local_b0;
  __index_type local_98;
  LiteralExpressionSyntax *local_90;
  undefined1 local_88 [24];
  byte local_70 [8];
  __index_type local_68;
  Token *local_48;
  string_view local_40;
  
  local_88._8_8_ = local_88._0_8_;
  this = &syntax->literal;
  local_40 = parsing::Token::valueText(this);
  auVar1 = (undefined1  [16])_local_b8;
  pcVar4 = local_40._M_str;
  sVar5 = local_40._M_len;
  this_00 = ((context->scope).ptr)->compilation;
  local_90 = syntax;
  local_48 = this;
  if (sVar5 == 0) {
    _local_b8 = ZEXT412(8) << 0x40;
    local_b0._6_2_ = auVar1._14_2_;
    local_b0._4_2_ = 0;
    SVInt::clearUnusedBits((SVInt *)&local_b8);
    local_88._8_6_ = local_b8._8_6_;
    local_88._0_8_ = local_b8.val;
    if (0x40 < (uint)local_b0._0_4_ ||
        ((undefined1  [16])_local_b8 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_b0;
      _local_b8 = (SourceRange)(auVar1 << 0x40);
    }
    local_68 = '\x01';
    args_3 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                       (&this_00->constantAllocator,(ConstantValue *)local_88);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)local_88);
    if (((0x40 < (uint)local_b0._0_4_) ||
        (((undefined1  [16])_local_b8 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0))
       && ((void *)local_b8.val != (void *)0x0)) {
      operator_delete__(local_b8.pVal);
    }
    width = 8;
  }
  else {
    width = (int)local_40._M_len * 8;
    if (0xffffff < width) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      this_01 = ASTContext::addDiag(context,(DiagCode)0x1d0009,sourceRange);
      local_88._0_8_ = ZEXT48(width);
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&this_01->args,(unsigned_long *)local_88);
      local_88._0_8_ = 0xffffff;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&this_01->args,(unsigned_long *)local_88);
      pEVar2 = Expression::badExpr(this_00,(Expression *)0x0);
      return pEVar2;
    }
    local_88._8_8_ = 0;
    local_88._0_8_ = local_70;
    local_88._16_8_ = 0x28;
    do {
      local_b8.val._0_1_ = pcVar4[sVar5 - 1];
      SmallVectorBase<std::byte>::emplace_back<std::byte>
                ((SmallVectorBase<std::byte> *)local_88,(byte *)&local_b8.val);
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
    local_c8.val = 0;
    local_bc = 0;
    local_c0 = width;
    SVInt::initSlowCase((SVInt *)&local_c8,
                        (span<const_std::byte,_18446744073709551615UL>)local_88._0_16_);
    auVar1 = (undefined1  [16])_local_b8;
    local_b8 = local_c8;
    local_b0._4_1_ = (undefined1)local_bc;
    local_b0._0_4_ = local_c0;
    local_b0._6_2_ = auVar1._14_2_;
    local_b0._5_1_ = local_bc._1_1_;
    if (0x40 < local_c0 || (local_bc & 0x100) != 0) {
      local_c8.val = 0;
    }
    local_98 = 1;
    args_3 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                       (&this_00->constantAllocator,(ConstantValue *)&local_b8);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_b8);
    if (((0x40 < local_c0) || ((local_bc & 0x100) != 0)) && ((void *)local_c8.val != (void *)0x0)) {
      operator_delete__(local_c8.pVal);
    }
    if ((byte *)local_88._0_8_ != local_70) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  args = Compilation::getType(this_00,width,(bitmask<slang::ast::IntegralFlags>)0x0);
  local_88._0_16_ = (undefined1  [16])parsing::Token::rawText(local_48);
  _local_b8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_90);
  pSVar3 = BumpAllocator::
           emplace<slang::ast::StringLiteral,slang::ast::Type_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue&,slang::SourceRange>
                     (&this_00->super_BumpAllocator,args,&local_40,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_88,args_3,
                      (SourceRange *)&local_b8);
  return &pSVar3->super_Expression;
}

Assistant:

Expression& StringLiteral::fromSyntax(const ASTContext& context,
                                      const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::StringLiteralExpression);

    std::string_view value = syntax.literal.valueText();
    bitwidth_t width;
    ConstantValue* intVal;

    auto& comp = context.getCompilation();
    if (value.empty()) {
        // [11.10.3] says that empty string literals take on a value of "\0" (8 zero bits).
        width = 8;
        intVal = comp.allocConstant(SVInt(8, 0, false));
    }
    else {
        width = bitwidth_t(value.size() * 8);
        if (width > (uint32_t)SVInt::MAX_BITS) {
            context.addDiag(diag::PackedTypeTooLarge, syntax.sourceRange())
                << width << (uint32_t)SVInt::MAX_BITS;
            return badExpr(comp, nullptr);
        }

        // String literals represented as integers put the first character on the
        // left, which translates to the msb, so we have to reverse the string.
        SmallVector<byte> bytes;
        for (char c : std::views::reverse(value))
            bytes.push_back((byte)c);

        intVal = comp.allocConstant(SVInt(width, bytes, false));
    }

    auto& type = comp.getType(width, IntegralFlags::Unsigned);
    return *comp.emplace<StringLiteral>(type, value, syntax.literal.rawText(), *intVal,
                                        syntax.sourceRange());
}